

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

UniquePtr<struct_stack_st_X509> __thiscall
anon_unknown.dwarf_862632::CertsToStack
          (anon_unknown_dwarf_862632 *this,vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  pointer ppxVar1;
  __uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter> sk;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  pointer ppxVar3;
  UniquePtr<struct_stack_st_X509> stack;
  __uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter> local_40;
  bssl local_38 [8];
  
  local_40._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (tuple<stack_st_X509_*,_bssl::internal::Deleter>)OPENSSL_sk_new_null();
  if ((_Head_base<0UL,_stack_st_X509_*,_false>)
      local_40._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    ppxVar3 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppxVar1 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      sk._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
           local_40._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
      if (ppxVar3 == ppxVar1) {
        *(tuple<stack_st_X509_*,_bssl::internal::Deleter> *)this =
             local_40._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
        local_40._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
             (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>)0x0;
        goto LAB_003406fc;
      }
      bssl::UpRef(local_38,*ppxVar3);
      eVar2 = bssl::PushToStack<stack_st_X509>
                        ((stack_st_X509 *)
                         sk._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,
                         (UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> *)local_38)
      ;
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_38);
      ppxVar3 = ppxVar3 + 1;
    } while (eVar2);
  }
  *(undefined8 *)this = 0;
LAB_003406fc:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_40);
  return (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509)> CertsToStack(
    const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> stack(sk_X509_new_null());
  if (!stack) {
    return nullptr;
  }
  for (auto cert : certs) {
    if (!bssl::PushToStack(stack.get(), bssl::UpRef(cert))) {
      return nullptr;
    }
  }

  return stack;
}